

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

uint lyd_list_pos(lyd_node *node)

{
  LYS_NODE LVar1;
  lys_node **pplVar2;
  lys_node **pplVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (node != (lyd_node *)0x0) {
    pplVar2 = &node->schema;
    LVar1 = (*pplVar2)->nodetype;
    if ((LVar1 == LYS_LIST) || (LVar1 == LYS_LEAFLIST)) {
      uVar4 = 0;
      do {
        pplVar3 = &node->schema;
        node = node->prev;
        uVar4 = uVar4 + (*pplVar3 == *pplVar2);
      } while (node->next != (lyd_node *)0x0);
    }
  }
  return uVar4;
}

Assistant:

API unsigned int
lyd_list_pos(const struct lyd_node *node)
{
    unsigned int pos;
    struct lys_node *schema;

    if (!node || ((node->schema->nodetype != LYS_LIST) && (node->schema->nodetype != LYS_LEAFLIST))) {
        return 0;
    }

    schema = node->schema;
    pos = 0;
    do {
        if (node->schema == schema) {
            ++pos;
        }
        node = node->prev;
    } while (node->next);

    return pos;
}